

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmConstant *argument)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  ExpressionContext *ctx_00;
  RegVmLoweredInstruction *instruction;
  
  ctx_00 = (ExpressionContext *)0x70;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  instruction = (RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar2);
  pAVar1 = ctx->allocator;
  instruction->location = location;
  instruction->code = code;
  instruction->rA = rA;
  instruction->rB = rB;
  instruction->rC = rC;
  instruction->argument = argument;
  (instruction->preKillRegisters).allocator = pAVar1;
  (instruction->preKillRegisters).data = (instruction->preKillRegisters).little;
  (instruction->preKillRegisters).count = 0;
  (instruction->preKillRegisters).max = 8;
  (instruction->postKillRegisters).allocator = pAVar1;
  (instruction->postKillRegisters).data = (instruction->postKillRegisters).little;
  (instruction->postKillRegisters).count = 0;
  (instruction->postKillRegisters).max = 8;
  instruction->parent = (RegVmLoweredBlock *)0x0;
  instruction->prevSibling = (RegVmLoweredInstruction *)0x0;
  instruction->nextSibling = (RegVmLoweredInstruction *)0x0;
  AddInstruction(this,ctx_00,instruction);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmConstant *argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, argument));
}